

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readgamma.hpp
# Opt level: O3

vector<TensorEntry,_std::allocator<TensorEntry>_> *
readGamma(vector<TensorEntry,_std::allocator<TensorEntry>_> *__return_storage_ptr__,int n)

{
  pointer *ppTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  iterator __position;
  pointer pTVar4;
  uint uVar5;
  char cVar6;
  long *plVar7;
  istream *piVar8;
  uint *puVar9;
  long lVar10;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *extraout_RAX;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *pvVar11;
  undefined8 uVar12;
  uint uVar13;
  size_type *psVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  TensorEntry entry;
  string line;
  string __str;
  ifstream sparsefile;
  TensorEntry local_2a4;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *local_298;
  undefined8 local_290;
  undefined1 local_288 [32];
  TensorEntry local_268;
  string local_258;
  long local_238 [65];
  
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = (vector<TensorEntry,_std::allocator<TensorEntry>_> *)local_288;
  local_290 = 0;
  local_288[0] = 0;
  uVar16 = -n;
  if (0 < n) {
    uVar16 = n;
  }
  uVar17 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar5 = 4;
    do {
      uVar17 = uVar5;
      uVar13 = (uint)uVar15;
      if (uVar13 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001578b9;
      }
      if (uVar13 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001578b9;
      }
      if (uVar13 < 10000) goto LAB_001578b9;
      uVar15 = uVar15 / 10000;
      uVar5 = uVar17 + 4;
    } while (99999 < uVar13);
    uVar17 = uVar17 + 1;
  }
LAB_001578b9:
  local_288._16_8_ = &local_268;
  std::__cxx11::string::_M_construct((ulong)(local_288 + 0x10),(char)uVar17 - (char)(n >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)(short *)local_288._16_8_ + (ulong)((uint)n >> 0x1f)),uVar17,uVar16);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)(local_288 + 0x10),0,(char *)0x0,0x198dc5);
  paVar2 = &local_258.field_2;
  psVar14 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_258.field_2._M_allocated_capacity = *psVar14;
    local_258.field_2._8_8_ = plVar7[3];
    local_258._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar14;
    local_258._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_258._M_string_length = plVar7[1];
  *plVar7 = (long)psVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::ifstream::ifstream(local_238,(string *)&local_258,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((TensorEntry *)local_288._16_8_ != &local_268) {
    operator_delete((void *)local_288._16_8_);
  }
  while( true ) {
    cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_298,cVar6);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(local_238);
      pvVar11 = (vector<TensorEntry,_std::allocator<TensorEntry>_> *)local_288;
      if (local_298 != pvVar11) {
        operator_delete(local_298);
        pvVar11 = extraout_RAX;
      }
      return pvVar11;
    }
    std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_298);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_288 + 0x10),&local_258,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    pcVar3 = *(char **)(short *)local_288._16_8_;
    puVar9 = (uint *)__errno_location();
    uVar16 = *puVar9;
    pvVar11 = (vector<TensorEntry,_std::allocator<TensorEntry>_> *)(ulong)uVar16;
    *puVar9 = 0;
    lVar10 = strtol(pcVar3,(char **)&local_258,10);
    if (local_258._M_dataplus._M_p == pcVar3) break;
    if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (uVar17 = *puVar9, uVar17 == 0x22))
    goto LAB_00157c56;
    if (uVar17 == 0) {
      *puVar9 = uVar16;
      uVar17 = uVar16;
    }
    local_2a4.a = (short)lVar10;
    pcVar3 = *(char **)&((TensorEntry *)(local_288._16_8_ + 0x18))->val;
    *puVar9 = 0;
    lVar10 = strtol(pcVar3,(char **)&local_258,10);
    if (local_258._M_dataplus._M_p == pcVar3) {
LAB_00157c32:
      std::__throw_invalid_argument("stoi");
LAB_00157c3e:
      std::__throw_out_of_range("stoi");
      break;
    }
    if (lVar10 - 0x80000000U < 0xffffffff00000000) goto LAB_00157c3e;
    uVar16 = *puVar9;
    pvVar11 = (vector<TensorEntry,_std::allocator<TensorEntry>_> *)(ulong)uVar16;
    if (uVar16 == 0x22) goto LAB_00157c3e;
    if (uVar16 == 0) {
      *puVar9 = uVar17;
      pvVar11 = (vector<TensorEntry,_std::allocator<TensorEntry>_> *)(ulong)uVar17;
    }
    local_2a4.b = (short)lVar10;
    pcVar3 = *(char **)&((TensorEntry *)(local_288._16_8_ + 0x3c))->c;
    *puVar9 = 0;
    lVar10 = strtol(pcVar3,(char **)&local_258,10);
    if (local_258._M_dataplus._M_p == pcVar3) {
      std::__throw_invalid_argument("stoi");
      goto LAB_00157c32;
    }
    if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (uVar16 = *puVar9, uVar16 == 0x22))
    goto LAB_00157c62;
    if (uVar16 == 0) {
      uVar16 = (uint)pvVar11;
      *puVar9 = uVar16;
    }
    local_2a4.c = (short)lVar10;
    pcVar3 = *(char **)&((TensorEntry *)(local_288._16_8_ + 0x60))->a;
    *puVar9 = 0;
    fVar18 = strtof(pcVar3,(char **)&local_258);
    if (local_258._M_dataplus._M_p == pcVar3) goto LAB_00157c6e;
    if (*puVar9 == 0) {
      *puVar9 = uVar16;
    }
    else if (*puVar9 == 0x22) goto LAB_00157c7a;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_2a4.val = fVar18;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<TensorEntry,std::allocator<TensorEntry>>::_M_realloc_insert<TensorEntry_const&>
                ((vector<TensorEntry,std::allocator<TensorEntry>> *)__return_storage_ptr__,
                 __position,&local_2a4);
    }
    else {
      (__position._M_current)->val = fVar18;
      (__position._M_current)->a = local_2a4.a;
      (__position._M_current)->b = local_2a4.b;
      (__position._M_current)->c = local_2a4.c;
      *(undefined2 *)&(__position._M_current)->field_0x6 = local_2a4._6_2_;
      ppTVar1 = &(__return_storage_ptr__->
                 super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + 0x10));
  }
  std::__throw_invalid_argument("stoi");
LAB_00157c56:
  std::__throw_out_of_range("stoi");
LAB_00157c62:
  std::__throw_out_of_range("stoi");
LAB_00157c6e:
  __return_storage_ptr__ = pvVar11;
  std::__throw_invalid_argument("stof");
LAB_00157c7a:
  uVar12 = std::__throw_out_of_range("stof");
  std::ifstream::~ifstream(local_238);
  if (local_298 != (vector<TensorEntry,_std::allocator<TensorEntry>_> *)local_288) {
    operator_delete(local_298);
  }
  pTVar4 = (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar4 != (pointer)0x0) {
    operator_delete(pTVar4);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

static std::vector<TensorEntry> readGamma(int n)
{
    std::vector<TensorEntry> sparsegamma;
    std::string line;
    std::ifstream sparsefile("../gamma/sparse" + std::to_string(n));
    TensorEntry entry;
    while(getline(sparsefile, line))
    {
        std::vector<std::string> tokens = split(line.substr(1, line.length() - 3), ',');
        entry.a = std::stoi(tokens[0]);
        entry.b = std::stoi(tokens[1]);
        entry.c = std::stoi(tokens[2]);
        entry.val = std::stof(tokens[3]);
        sparsegamma.push_back(entry);
    }
    sparsefile.close();
    return sparsegamma;
}